

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O3

int __thiscall
trieste::detail::InsideStar<5UL>::clone
          (InsideStar<5UL> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined1 local_29;
  InsideStar<5UL> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28 = (InsideStar<5UL> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::InsideStar<5ul>,std::allocator<trieste::detail::InsideStar<5ul>>,trieste::detail::InsideStar<5ul>const&>
            (a_Stack_20,&local_28,(allocator<trieste::detail::InsideStar<5UL>_> *)&local_29,
             (InsideStar<5UL> *)__fn);
  (this->super_PatternDef)._vptr_PatternDef = (_func_int **)local_28;
  (this->super_PatternDef).continuation.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)a_Stack_20[0]._M_pi;
  return (int)this;
}

Assistant:

PatternPtr clone() const& override
      {
        return std::make_shared<InsideStar>(*this);
      }